

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

void draw_demo_menu(DEMO_MENU *menu)

{
  ALLEGRO_FONT *pAVar1;
  int iVar2;
  int iVar3;
  _func_int_DEMO_MENU_ptr_int_int *p_Var4;
  int iVar5;
  DEMO_MENU *pDVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  char *pcVar12;
  undefined4 uVar13;
  float fVar14;
  undefined8 uVar15;
  
  draw_background();
  draw_credits();
  iVar5 = screen_width / 2;
  iVar7 = screen_height / 6;
  iVar2 = al_get_font_line_height(demo_data[2].dat);
  iVar7 = iVar7 - iVar2 / 2;
  pAVar1 = (ALLEGRO_FONT *)demo_data[2].dat;
  uVar15 = 0x3e000000;
  pcVar12 = (char *)al_map_rgba_f(0x3e000000,0x3e000000,0x3e000000,0x3e800000);
  demo_textprintf_centre(pAVar1,iVar5 + 6,iVar7 + 5,0x1179d8,pcVar12,uVar15);
  pAVar1 = (ALLEGRO_FONT *)demo_data[2].dat;
  uVar15 = 0x3f800000;
  pcVar12 = (char *)al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
  demo_textprintf_centre(pAVar1,iVar5,iVar7,0x1179d8,pcVar12,uVar15);
  p_Var4 = menu->proc;
  iVar7 = 0x10;
  iVar2 = 0x10;
  if (p_Var4 != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar2 = 0;
    pDVar6 = menu;
    do {
      iVar5 = (*p_Var4)(pDVar6,5,0);
      iVar2 = iVar2 + iVar5;
      p_Var4 = pDVar6[1].proc;
      pDVar6 = pDVar6 + 1;
    } while (p_Var4 != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
    iVar2 = iVar2 + 0x10;
  }
  iVar5 = (screen_height * 3) / 5 - iVar2 / 2;
  p_Var4 = menu->proc;
  if (p_Var4 != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar7 = 0;
    pDVar6 = menu;
    do {
      iVar3 = (*p_Var4)(pDVar6,4,0);
      pDVar6->w = iVar3;
      if (iVar7 < iVar3) {
        iVar7 = iVar3;
      }
      pDVar6->x = (screen_width - iVar3) / 2;
      p_Var4 = pDVar6[1].proc;
      pDVar6 = pDVar6 + 1;
    } while (p_Var4 != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
    iVar7 = iVar7 + 0x10;
  }
  iVar3 = screen_width / 3;
  if (screen_width / 3 < iVar7) {
    iVar3 = iVar7;
  }
  if (screen_width <= iVar3) {
    iVar3 = screen_width;
  }
  iVar7 = (screen_width - iVar3) / 2;
  fVar8 = (float)iVar7;
  fVar9 = (float)iVar5;
  fVar10 = (float)(iVar7 + iVar3);
  uVar13 = 0x3e810625;
  uVar11 = al_map_rgba_f(0x3e6353f8,0x3e810625,0x3e8a3d71,0x3f19999a);
  fVar14 = fVar9;
  al_draw_filled_rectangle(fVar8,fVar9,fVar10,(float)(iVar2 + iVar5),uVar11,uVar13);
  uVar11 = al_map_rgb(0,0,0);
  al_draw_rectangle(fVar8,fVar9,fVar10,(float)(iVar2 + iVar5),uVar11,fVar14,0x3f800000);
  p_Var4 = menu->proc;
  if (p_Var4 != (_func_int_DEMO_MENU_ptr_int_int *)0x0) {
    iVar5 = iVar5 + 8;
    do {
      (*p_Var4)(menu,1,iVar5);
      menu->y = iVar5;
      iVar7 = (*menu->proc)(menu,5,0);
      menu->h = iVar7;
      iVar5 = iVar5 + iVar7;
      p_Var4 = menu[1].proc;
      menu = menu + 1;
    } while (p_Var4 != (_func_int_DEMO_MENU_ptr_int_int *)0x0);
  }
  return;
}

Assistant:

void draw_demo_menu(DEMO_MENU * menu)
{
   int i, x, y, h, w;
   int tmp;
   static char logo_text[] = "Demo Game";

   draw_background();
   draw_credits();

   x = screen_width / 2;
   y = 1 * screen_height / 6 - al_get_font_line_height(demo_font_logo) / 2;
   demo_textprintf_centre(demo_font_logo, x + 6, y + 5,
                        al_map_rgba_f(0.125, 0.125, 0.125, 0.25), logo_text);
   demo_textprintf_centre(demo_font_logo, x, y, al_map_rgb_f(1, 1, 1), logo_text);

   /* calculate height of the whole menu and the starting y coordinate */
   h = 0;
   for (i = 0, h = 0; menu[i].proc != NULL; i++) {
      h += menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
   }
   h += 2 * 8;
   y = 3 * screen_height / 5 - h / 2;

   /* calculate the width of the whole menu */
   w = 0;
   for (i = 0; menu[i].proc != NULL; i++) {
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_WIDTH, 0);
      menu[i].w = tmp;
      menu[i].x = (screen_width - tmp) / 2;
      if (tmp > w) {
         w = tmp;
      }
   }
   w += 2 * 8;
   if (w < screen_width / 3) w =  screen_width / 3;
   if (w > screen_width) w = screen_width;
   x = (screen_width - w) / 2;

   /* draw menu background */
   al_draw_filled_rectangle(x, y, x + w, y + h,
      al_map_rgba_f(0.37 * 0.6, 0.42 * 0.6, 0.45 * 0.6, 0.6));
   al_draw_rectangle(x, y, x + w, y + h, al_map_rgb(0, 0, 0), 1);

   /* draw menu items */
   y += 8;
   for (i = 0; menu[i].proc != NULL; i++) {
      menu[i].proc(&menu[i], DEMO_MENU_MSG_DRAW, y);
      menu[i].y = y;
      tmp = menu[i].proc(&menu[i], DEMO_MENU_MSG_HEIGHT, 0);
      menu[i].h = tmp;
      y += tmp;
   }
}